

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus
ZydisDecoderDecodeFull
          (ZydisDecoder *decoder,void *buffer,ZyanUSize length,ZydisDecodedInstruction *instruction,
          ZydisDecodedOperand *operands)

{
  ZyanStatus status_047620348_1;
  ZyanStatus status_047620348;
  ZydisDecoderContext context;
  ZydisDecodedOperand *operands_local;
  ZydisDecodedInstruction *instruction_local;
  ZyanUSize length_local;
  void *buffer_local;
  ZydisDecoder *decoder_local;
  
  if ((((decoder == (ZydisDecoder *)0x0) || (instruction == (ZydisDecodedInstruction *)0x0)) ||
      (buffer == (void *)0x0)) || (operands == (ZydisDecodedOperand *)0x0)) {
    decoder_local._4_4_ = 0x80100004;
  }
  else if (length == 0) {
    decoder_local._4_4_ = 0x80200000;
  }
  else if ((decoder->decoder_mode & 1) == 0) {
    context._24_8_ = operands;
    decoder_local._4_4_ =
         ZydisDecoderDecodeInstruction
                   (decoder,(ZydisDecoderContext *)&status_047620348_1,buffer,length,instruction);
    if (((decoder_local._4_4_ & 0x80000000) == 0) &&
       (decoder_local._4_4_ =
             ZydisDecoderDecodeOperands
                       (decoder,(ZydisDecoderContext *)&status_047620348_1,instruction,
                        (ZydisDecodedOperand *)context._24_8_,instruction->operand_count),
       (decoder_local._4_4_ & 0x80000000) == 0)) {
      memset((void *)(context._24_8_ + (ulong)instruction->operand_count * 0x50),0,
             (long)(int)(10 - (uint)instruction->operand_count) * 0x50);
      decoder_local._4_4_ = 0x100000;
    }
  }
  else {
    decoder_local._4_4_ = 0x8010000d;
  }
  return decoder_local._4_4_;
}

Assistant:

ZyanStatus ZydisDecoderDecodeFull(const ZydisDecoder* decoder,
    const void* buffer, ZyanUSize length, ZydisDecodedInstruction* instruction,
    ZydisDecodedOperand operands[ZYDIS_MAX_OPERAND_COUNT])
{
    if (!decoder || !instruction || !buffer || !operands)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }
    if (!length)
    {
        return ZYDIS_STATUS_NO_MORE_DATA;
    }
    if (decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_MINIMAL))
    {
        return ZYAN_STATUS_MISSING_DEPENDENCY; // TODO: Introduce better status code
    }

    ZydisDecoderContext context;
    ZYAN_CHECK(ZydisDecoderDecodeInstruction(decoder, &context, buffer, length, instruction));
    ZYAN_CHECK(ZydisDecoderDecodeOperands(decoder, &context, instruction, operands,
        instruction->operand_count));
    ZYAN_MEMSET(&operands[instruction->operand_count], 0,
        (ZYDIS_MAX_OPERAND_COUNT - instruction->operand_count) * sizeof(operands[0]));

    return ZYAN_STATUS_SUCCESS;
}